

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzysmp.cpp
# Opt level: O2

TPZFYsmpMatrix<std::complex<float>_> * __thiscall
TPZFYsmpMatrix<std::complex<float>_>::operator+
          (TPZFYsmpMatrix<std::complex<float>_> *__return_storage_ptr__,
          TPZFYsmpMatrix<std::complex<float>_> *this,TPZFYsmpMatrix<std::complex<float>_> *mat)

{
  _ComplexT _Var1;
  _ComplexT _Var2;
  complex<float> *pcVar3;
  long lVar4;
  long lVar5;
  
  (*(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
    _vptr_TPZSavable[0x4a])(this);
  TPZFYsmpMatrix(__return_storage_ptr__,this);
  lVar4 = (__return_storage_ptr__->fA).fNElements;
  lVar5 = 0;
  if (lVar4 < 1) {
    lVar4 = lVar5;
  }
  for (; lVar4 != lVar5; lVar5 = lVar5 + 1) {
    pcVar3 = (__return_storage_ptr__->fA).fStore;
    _Var1 = (mat->fA).fStore[lVar5]._M_value;
    _Var2 = pcVar3[lVar5]._M_value;
    pcVar3[lVar5]._M_value =
         CONCAT44((float)(_Var2 >> 0x20) + (float)(_Var1 >> 0x20),(float)_Var2 + (float)_Var1);
  }
  return __return_storage_ptr__;
}

Assistant:

TPZFYsmpMatrix<TVar> TPZFYsmpMatrix<TVar>::operator+(const TPZFYsmpMatrix<TVar>&mat) const
{
	CheckTypeCompatibility(this,&mat);
	auto res(*this);
  const auto sizeA = res.fA.size();
  for(auto i = 0; i < sizeA; i++) res.fA[i] += mat.fA[i];
	return res;
}